

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

void Gli_ManVerify(Gli_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Gli_Obj_t *pGStack_18;
  int i;
  Gli_Obj_t *pObj;
  Gli_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->nObjData) {
      pGStack_18 = Gli_ManObj(p,local_1c);
      bVar2 = pGStack_18 != (Gli_Obj_t *)0x0;
    }
    if (!bVar2) {
      return;
    }
    if ((*(uint *)pGStack_18 >> 1 & 1) != (*(uint *)pGStack_18 >> 2 & 1)) {
      __assert_fail("pObj->fPhase == pObj->fPhase2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                    ,0x235,"void Gli_ManVerify(Gli_Man_t *)");
    }
    if ((pGStack_18->field_10).iFanout < (pGStack_18->field_9).iFanin) break;
    iVar1 = Gli_ObjSize(pGStack_18);
    local_1c = iVar1 + local_1c;
  }
  __assert_fail("pObj->nGlitches >= pObj->nSwitches",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaGlitch.c"
                ,0x236,"void Gli_ManVerify(Gli_Man_t *)");
}

Assistant:

void Gli_ManVerify( Gli_Man_t * p )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachObj( p, pObj, i )
    {
        assert( pObj->fPhase == pObj->fPhase2 );
        assert( pObj->nGlitches >= pObj->nSwitches );
    }
}